

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void helper_sve_fexpa_s_aarch64(void *vd,void *vn,uint32_t desc)

{
  uint32_t uVar1;
  uint32_t uVar2;
  intptr_t iVar3;
  uint32_t exp;
  intptr_t idx;
  uint32_t nn;
  uint32_t *n;
  uint32_t *d;
  intptr_t opr_sz;
  intptr_t i;
  uint32_t desc_local;
  void *vn_local;
  void *vd_local;
  
  iVar3 = simd_oprsz(desc);
  for (opr_sz = 0; opr_sz < iVar3 / 4; opr_sz = opr_sz + 1) {
    uVar2 = *(uint32_t *)((long)vn + opr_sz * 4);
    uVar1 = extract32(uVar2,0,6);
    uVar2 = extract32(uVar2,6,8);
    *(uint32_t *)((long)vd + opr_sz * 4) = helper_sve_fexpa_s_aarch64::coeff[uVar1] | uVar2 << 0x17;
  }
  return;
}

Assistant:

void HELPER(sve_fexpa_s)(void *vd, void *vn, uint32_t desc)
{
    /* These constants are cut-and-paste directly from the ARM pseudocode.  */
    static const uint32_t coeff[] = {
        0x000000, 0x0164d2, 0x02cd87, 0x043a29,
        0x05aac3, 0x071f62, 0x08980f, 0x0a14d5,
        0x0b95c2, 0x0d1adf, 0x0ea43a, 0x1031dc,
        0x11c3d3, 0x135a2b, 0x14f4f0, 0x16942d,
        0x1837f0, 0x19e046, 0x1b8d3a, 0x1d3eda,
        0x1ef532, 0x20b051, 0x227043, 0x243516,
        0x25fed7, 0x27cd94, 0x29a15b, 0x2b7a3a,
        0x2d583f, 0x2f3b79, 0x3123f6, 0x3311c4,
        0x3504f3, 0x36fd92, 0x38fbaf, 0x3aff5b,
        0x3d08a4, 0x3f179a, 0x412c4d, 0x4346cd,
        0x45672a, 0x478d75, 0x49b9be, 0x4bec15,
        0x4e248c, 0x506334, 0x52a81e, 0x54f35b,
        0x5744fd, 0x599d16, 0x5bfbb8, 0x5e60f5,
        0x60ccdf, 0x633f89, 0x65b907, 0x68396a,
        0x6ac0c7, 0x6d4f30, 0x6fe4ba, 0x728177,
        0x75257d, 0x77d0df, 0x7a83b3, 0x7d3e0c,
    };
    intptr_t i, opr_sz = simd_oprsz(desc) / 4;
    uint32_t *d = vd, *n = vn;

    for (i = 0; i < opr_sz; i++) {
        uint32_t nn = n[i];
        intptr_t idx = extract32(nn, 0, 6);
        uint32_t exp = extract32(nn, 6, 8);
        d[i] = coeff[idx] | (exp << 23);
    }
}